

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

void __thiscall
pbrt::RGBFilm::AddSplat(RGBFilm *this,Point2f *p,SampledSpectrum L,SampledWavelengths *lambda)

{
  AtomicDouble *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Pixel *pPVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  ulong uVar10;
  double dVar11;
  long lVar12;
  GaussianFilter *this_00;
  uint uVar13;
  ulong uVar14;
  undefined8 unaff_R15;
  ulong uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [56];
  undefined1 auVar23 [60];
  undefined1 auVar22 [64];
  float fVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  RGB RVar37;
  Tuple2<pbrt::Point2,_float> local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  SampledSpectrum local_40;
  
  auVar22._8_56_ = L._16_56_;
  auVar22._0_8_ = L.values.values._8_8_;
  auVar20._8_56_ = L._8_56_;
  auVar20._0_8_ = L.values.values._0_8_;
  local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar20._0_16_,auVar22._0_16_);
  auVar23 = ZEXT1260(local_40.values.values._4_12_);
  if (!NAN(L.values.values[0])) {
    uVar10 = 0xffffffffffffffff;
    do {
      auVar21 = auVar20._8_56_;
      if (uVar10 == 2) goto LAB_003bf62a;
      fVar19 = local_40.values.values[uVar10 + 2];
      auVar20 = ZEXT464((uint)fVar19);
      auVar21 = (undefined1  [56])0x0;
      uVar10 = uVar10 + 1;
    } while (!NAN(fVar19) && !NAN(fVar19));
    if (2 < uVar10) {
LAB_003bf62a:
      RVar37 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,&local_40,lambda);
      auVar36._0_4_ = RVar37.b;
      auVar36._4_60_ = auVar23;
      auVar32._0_8_ = RVar37._0_8_;
      auVar32._8_56_ = auVar21;
      fVar19 = this->maxComponentValue;
      local_68 = auVar32._0_16_;
      auVar18 = vmovshdup_avx(local_68);
      auVar18 = vmaxss_avx(auVar18,local_68);
      auVar18 = vmaxss_avx(auVar36._0_16_,auVar18);
      fVar24 = fVar19 / auVar18._0_4_;
      if (fVar19 < auVar18._0_4_) {
        local_68._0_4_ = RVar37.r * fVar24;
        local_68._4_4_ = RVar37.g * fVar24;
        local_68._8_4_ = auVar21._0_4_ * fVar24;
        local_68._12_4_ = auVar21._4_4_ * fVar24;
      }
      auVar20 = ZEXT1664(local_68);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
      auVar6._8_4_ = 0x3f000000;
      auVar6._0_8_ = 0x3f0000003f000000;
      auVar6._12_4_ = 0x3f000000;
      auVar17 = vaddps_avx512vl(auVar17,auVar6);
      uVar10 = *(ulong *)((this->super_FilmBase).filter.
                          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                          .bits & 0xffffffffffff);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar10;
      auVar6 = vsubps_avx(auVar17,auVar28);
      auVar29._0_4_ = auVar17._0_4_ + (float)uVar10;
      auVar29._4_4_ = auVar17._4_4_ + (float)(uVar10 >> 0x20);
      auVar29._8_4_ = auVar17._8_4_ + 0.0;
      auVar29._12_4_ = auVar17._12_4_ + 0.0;
      auVar17 = vroundps_avx(auVar29,9);
      auVar28 = vroundps_avx(auVar6,9);
      auVar6 = vpcmpeqd_avx(auVar6,auVar6);
      auVar30._0_4_ = (int)auVar17._0_4_;
      auVar30._4_4_ = (int)auVar17._4_4_;
      auVar30._8_4_ = (int)auVar17._8_4_;
      auVar30._12_4_ = (int)auVar17._12_4_;
      auVar31._0_4_ = (int)auVar28._0_4_;
      auVar31._4_4_ = (int)auVar28._4_4_;
      auVar31._8_4_ = (int)auVar28._8_4_;
      auVar31._12_4_ = (int)auVar28._12_4_;
      auVar6 = vpsubd_avx(auVar30,auVar6);
      auVar17 = vpminsd_avx(auVar6,auVar31);
      auVar6 = vpmaxsd_avx(auVar31,auVar6);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>;
      local_58 = vpmaxsd_avx(auVar17,auVar34);
      uVar13 = local_58._4_4_;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>;
      auVar6 = vpminsd_avx(auVar35,auVar6);
      uVar10 = vpcmpd_avx512vl(local_58,auVar6,5);
      uVar9 = auVar6._4_4_;
      if ((int)auVar6._4_4_ < (int)uVar13) {
        uVar9 = uVar13;
      }
      if ((uVar10 & 3) == 0) {
        uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar19),auVar18,1);
        bVar16 = (bool)((byte)uVar7 & 1);
        auVar33 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_88 = vmovshdup_avx(local_68);
        auVar32 = ZEXT1664(local_88);
        local_78._4_12_ = auVar23._0_12_;
        local_78._0_4_ =
             (uint)bVar16 * (int)(auVar36._0_4_ * fVar24) + (uint)!bVar16 * (int)auVar36._0_4_;
        auVar22 = ZEXT1664(local_78);
        uVar15 = CONCAT44((int)((ulong)unaff_R15 >> 0x20),local_58._0_4_);
        auVar36 = ZEXT1664(local_58);
        uVar10 = (ulong)uVar13 << 0x20 | uVar15;
        do {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
          local_98 = auVar36._0_16_;
          auVar18 = vcvtdq2ps_avx(local_98);
          auVar18 = vsubps_avx(auVar26,auVar18);
          auVar8._8_4_ = 0xbf000000;
          auVar8._0_8_ = 0xbf000000bf000000;
          auVar8._12_4_ = 0xbf000000;
          auVar18 = vaddps_avx512vl(auVar18,auVar8);
          local_a0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar18);
          uVar14 = (this->super_FilmBase).filter.
                   super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                   .bits;
          uVar13 = (uint)(ushort)(uVar14 >> 0x30);
          auVar17 = auVar33._0_16_;
          if (uVar14 >> 0x30 < 3) {
            this_00 = (GaussianFilter *)(uVar14 & 0xffffffffffff);
            if (uVar13 == 2) {
              fVar19 = GaussianFilter::Evaluate(this_00,(Point2f *)&local_a0);
              goto LAB_003bf80e;
            }
            auVar28 = vandps_avx(auVar18,auVar17);
            if (auVar28._0_4_ <= (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x) {
              auVar18 = vmovshdup_avx(auVar18);
              auVar18 = vandps_avx(auVar18,auVar17);
              uVar7 = vcmpss_avx512f(auVar18,ZEXT416((uint)(this_00->radius).
                                                           super_Tuple2<pbrt::Vector2,_float>.y),2);
              fVar19 = (float)((uint)((byte)uVar7 & 1) * 0x3f800000);
              goto LAB_003bf82f;
            }
          }
          else {
            uVar13 = uVar13 - 2;
            if (uVar13 < 2) {
              fVar19 = MitchellFilter::Evaluate
                                 ((MitchellFilter *)(uVar14 & 0xffffffffffff),(Point2f *)&local_a0);
            }
            else {
              if (uVar13 != 2) {
                auVar27._8_8_ = 0;
                auVar27._0_8_ =
                     (((LanczosSincFilter *)(uVar14 & 0xffffffffffff))->radius).
                     super_Tuple2<pbrt::Vector2,_float>;
                auVar18 = vandps_avx(auVar18,auVar17);
                auVar18 = vsubps_avx(auVar27,auVar18);
                auVar18 = vmaxps_avx(auVar18,_DAT_003ea4e0);
                auVar17 = vmovshdup_avx(auVar18);
                fVar19 = auVar18._0_4_ * auVar17._0_4_;
                goto LAB_003bf82f;
              }
              fVar19 = LanczosSincFilter::Evaluate
                                 ((LanczosSincFilter *)(uVar14 & 0xffffffffffff),
                                  (Point2f *)&local_a0);
            }
LAB_003bf80e:
            auVar36 = ZEXT1664(local_98);
            auVar33 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            auVar32 = ZEXT1664(local_88);
            auVar22 = ZEXT1664(local_78);
            auVar20 = ZEXT1664(local_68);
LAB_003bf82f:
            if ((fVar19 != 0.0) || (NAN(fVar19))) {
              iVar2 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
              iVar3 = (this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
              iVar4 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
              lVar12 = 0;
              pPVar5 = (this->pixels).values;
              do {
                fVar24 = auVar20._0_4_;
                if (((int)lVar12 != 0) && (fVar24 = auVar32._0_4_, (int)lVar12 != 1)) {
                  fVar24 = auVar22._0_4_;
                }
                pAVar1 = pPVar5[(iVar3 - iVar2) * ((int)(uVar10 >> 0x20) - iVar4) +
                                ((int)uVar10 - iVar2)].splatRGB + lVar12;
                dVar25 = (double)(pAVar1->bits).super___atomic_base<unsigned_long>._M_i;
                do {
                  LOCK();
                  dVar11 = (double)(pAVar1->bits).super___atomic_base<unsigned_long>._M_i;
                  bVar16 = dVar25 == dVar11;
                  if (bVar16) {
                    (pAVar1->bits).super___atomic_base<unsigned_long>._M_i =
                         (__int_type_conflict)(dVar25 + (double)(fVar19 * fVar24));
                    dVar11 = dVar25;
                  }
                  UNLOCK();
                  dVar25 = dVar11;
                } while (!bVar16);
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
            }
          }
          uVar13 = auVar36._0_4_ + 1;
          uVar14 = uVar10 & 0xffffffff00000000;
          uVar10 = (uVar14 | uVar15) + 0x100000000;
          if (uVar13 != auVar6._0_4_) {
            uVar10 = uVar14 + uVar13;
          }
          auVar36 = ZEXT864(uVar10);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar10;
          uVar14 = vpcmpd_avx512vl(auVar18,local_58,4);
        } while (((uVar14 & 1) != 0) || (uVar9 != (uint)(uVar10 >> 0x20)));
      }
      return;
    }
  }
  LogFatal<char_const(&)[13]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/film.cpp"
             ,0x1e0,"Check failed: %s",(char (*) [13])"!L.HasNaNs()");
}

Assistant:

void RGBFilm::AddSplat(const Point2f &p, SampledSpectrum L,
                       const SampledWavelengths &lambda) {
    CHECK(!L.HasNaNs());
    // Convert sample radiance to _PixelSensor_ RGB
    RGB rgb = sensor->ToSensorRGB(L, lambda);

    // Optionally clamp sensor RGB value
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue) {
        rgb *= maxComponentValue / m;
    }

    // Compute bounds of affected pixels for splat, _splatBounds_
    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Vector2f radius = filter.Radius();
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - radius)),
                         Point2i(Floor(pDiscrete + radius)) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);

    for (Point2i pi : splatBounds) {
        // Evaluate filter at _pi_ and add splat contribution
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.splatRGB[i].Add(wt * rgb[i]);
        }
    }
}